

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::Add2Dpath
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::geometry::ChLinePath> *mpath,ChVector<double> *pos,
          ChMatrix33<double> *rot,double mthickness)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  long *plVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  pointer psVar9;
  long lVar10;
  ChCollisionShapeBullet *pCVar11;
  cbt2DsegmentShape *this_01;
  ulong uVar12;
  cbt2DarcShape *pcVar13;
  ChException *pCVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float mzthickness;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  ChVector<double> pos_prev;
  ChVector<double> pos_next;
  ChVector<double> dir_next;
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined1 local_198 [16];
  double local_188;
  double local_178;
  ChVector<double> *local_170;
  ChMatrix33<double> *local_168;
  shared_ptr<chrono::ChMaterialSurface> *local_160;
  double local_158;
  double dStack_150;
  double local_148;
  double local_138;
  double dStack_130;
  double local_128;
  double local_118;
  undefined8 uStack_110;
  shared_ptr<chrono::ChMaterialSurface> local_108;
  shared_ptr<chrono::ChMaterialSurface> local_f8;
  shared_ptr<chrono::ChMaterialSurface> local_e8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_170 = pos;
  local_168 = rot;
  local_160 = material;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x24])(0);
  peVar15 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  psVar9 = (peVar15->lines).
           super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((peVar15->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
    mzthickness = (float)mthickness;
    lVar17 = 8;
    uVar18 = 0;
    local_58 = 0x10000000000000;
    uStack_50 = 0x10000000000000;
    do {
      lVar10 = *(long *)((long)psVar9 + lVar17 + -8);
      p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar9->
                         super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar17);
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      if ((lVar10 == 0) ||
         (lVar10 = __dynamic_cast(lVar10,&geometry::ChLine::typeinfo,
                                  &geometry::ChLineSegment::typeinfo,0), lVar10 == 0)) {
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        psVar9 = (((mpath->
                   super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->lines).
                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)((long)psVar9 + lVar17 + -8);
        p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar9->
                           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr + lVar17);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        if ((lVar10 == 0) ||
           (lVar10 = __dynamic_cast(lVar10,&geometry::ChLine::typeinfo,
                                    &geometry::ChLineArc::typeinfo,0), lVar10 == 0)) {
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,
                     "Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment."
                     ,"");
          ChException::ChException(pCVar14,&local_b8);
          __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if (((*(double *)(lVar10 + 0x30) != 0.0) || (*(double *)(lVar10 + 0x38) != 0.0)) ||
           (NAN(*(double *)(lVar10 + 0x38)))) {
          pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,
                     "Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!","");
          ChException::ChException(pCVar14,&local_98);
          __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
        }
        local_118 = *(double *)(lVar10 + 0x50);
        local_178 = *(double *)(lVar10 + 0x58);
        uStack_110 = 0;
        local_48 = local_118 + -1e-07;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_118 - local_178;
        uVar4 = vcmpsd_avx512f(auVar21,ZEXT816(0x401921fb54442d18),0);
        bVar5 = (bool)((byte)uVar4 & 1);
        uStack_40 = 0;
        pCVar11 = (ChCollisionShapeBullet *)::operator_new(0x28);
        local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        p_Var1 = (local_160->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar11,PATH2D,&local_f8);
        if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pcVar13 = (cbt2DarcShape *)cbtAlignedAllocInternal(0x60,0x10);
        cbt2DarcShape::cbt2DarcShape
                  (pcVar13,(float)*(double *)(lVar10 + 0x10),(float)*(double *)(lVar10 + 0x18),
                   (float)*(double *)(lVar10 + 0x48),
                   (float)(double)((ulong)bVar5 * (long)local_48 + (ulong)!bVar5 * (long)local_118),
                   (float)local_178,*(bool *)(lVar10 + 0x60),mzthickness);
        pCVar11->m_bt_shape = (cbtCollisionShape *)pcVar13;
        (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
        (*(pcVar13->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xb])(pcVar13);
        injectShape(this,local_170,local_168,pCVar11);
      }
      else {
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if ((*(double *)(lVar10 + 0x20) != *(double *)(lVar10 + 0x38)) ||
           (NAN(*(double *)(lVar10 + 0x20)) || NAN(*(double *)(lVar10 + 0x38)))) {
          pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!","");
          ChException::ChException(pCVar14,&local_78);
          __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
        }
        local_1b8 = vcvtpd2ps_avx(*(undefined1 (*) [16])(lVar10 + 0x10));
        local_198 = vcvtpd2ps_avx(*(undefined1 (*) [16])(lVar10 + 0x28));
        pCVar11 = (ChCollisionShapeBullet *)::operator_new(0x28);
        local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        p_Var1 = (local_160->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar11,PATH2D,&local_e8);
        if (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_01 = (cbt2DsegmentShape *)cbtAlignedAllocInternal(0x68,0x10);
        cbt2DsegmentShape::cbt2DsegmentShape
                  (this_01,(cbtVector3 *)local_1b8,(cbtVector3 *)local_198,mzthickness);
        pCVar11->m_bt_shape = (cbtCollisionShape *)this_01;
        (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
        (*(this_01->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xb])(this_01);
        injectShape(this,local_170,local_168,pCVar11);
      }
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      uVar18 = uVar18 + 1;
      peVar15 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      uVar12 = uVar18;
      if ((ulong)((long)(peVar15->lines).
                        super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar15->lines).
                        super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar18) {
        (*(peVar15->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x12])(local_1b8);
        (*(((mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x13])(local_198);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (double)local_1b8._0_8_ - (double)local_198._0_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ =
             ((double)local_1b8._8_8_ - (double)local_198._8_8_) *
             ((double)local_1b8._8_8_ - (double)local_198._8_8_);
        auVar21 = vfmadd231sd_fma(auVar24,auVar22,auVar22);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_1a8 - local_188;
        auVar21 = vfmadd231sd_fma(auVar21,auVar26,auVar26);
        auVar21 = vsqrtsd_avx(auVar21,auVar21);
        if (auVar21._0_8_ < 1e-09) {
          uVar12 = 0;
        }
      }
      peVar15 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      psVar9 = (peVar15->lines).
               super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar12 < (ulong)((long)(peVar15->lines).
                                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4)) {
        plVar2 = *(long **)((long)psVar9 + lVar17 + -8);
        p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar9->
                           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr + lVar17);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
            peVar15 = (mpath->
                      super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        psVar9 = (peVar15->lines).
                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar3 = *(long **)&psVar9[uVar12].
                            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
        ;
        this_00._M_pi =
             psVar9[uVar12].super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          }
        }
        local_1a8 = 0.0;
        local_188 = 0.0;
        local_128 = 0.0;
        local_148 = 0.0;
        local_1b8 = ZEXT816(0);
        local_198 = ZEXT816(0);
        local_138 = 0.0;
        dStack_130 = 0.0;
        local_158 = 0.0;
        dStack_150 = 0.0;
        (**(code **)(*plVar2 + 0x58))(0x3ff0000000000000,plVar2,local_1b8);
        (**(code **)(*plVar3 + 0x58))(0,plVar3,local_198);
        (**(code **)(*plVar2 + 0x60))(0x3ff0000000000000,plVar2,&local_138);
        (**(code **)(*plVar3 + 0x60))(0,plVar3,&local_158);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dStack_130;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dStack_150;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_138;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_158;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_128;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_148;
        auVar21 = vunpcklpd_avx(auVar30,auVar25);
        auVar22 = vunpcklpd_avx(auVar29,auVar23);
        auVar34._0_8_ = auVar21._0_8_ * auVar21._0_8_;
        auVar34._8_8_ = auVar21._8_8_ * auVar21._8_8_;
        auVar22 = vfmadd213pd_fma(auVar22,auVar22,auVar34);
        auVar21 = vunpcklpd_avx(auVar32,auVar27);
        auVar21 = vfmadd213pd_fma(auVar21,auVar21,auVar22);
        auVar22 = vsqrtpd_avx(auVar21);
        auVar8._8_8_ = uStack_50;
        auVar8._0_8_ = local_58;
        uVar12 = vcmppd_avx512vl(auVar22,auVar8,5);
        auVar21 = vshufpd_avx(auVar22,auVar22,1);
        dVar36 = 1.0 / auVar21._0_8_;
        uVar7 = (uVar12 & 3) >> 1;
        auVar19._0_8_ =
             (double)(uVar7 * (long)(local_138 * dVar36) +
                     (ulong)!SUB81(uVar7,0) * 0x3ff0000000000000);
        auVar19._8_8_ = 0;
        dStack_130 = (double)(uVar7 * (long)(dStack_130 * dVar36));
        local_128 = (double)(uVar7 * (long)(local_128 * dVar36));
        dVar36 = 1.0 / auVar22._0_8_;
        bVar6 = (byte)(uVar12 & 3);
        local_158 = (double)((ulong)(bVar6 & 1) * (long)(local_158 * dVar36) +
                            (ulong)!(bool)(bVar6 & 1) * 0x3ff0000000000000);
        dStack_150 = (double)((ulong)(bVar6 & 1) * (long)(dStack_150 * dVar36));
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dStack_150;
        local_148 = (double)((ulong)(bVar6 & 1) * (long)(local_148 * dVar36));
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (double)local_1b8._0_8_ - (double)local_198._0_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ =
             ((double)local_1b8._8_8_ - (double)local_198._8_8_) *
             ((double)local_1b8._8_8_ - (double)local_198._8_8_);
        auVar21 = vfmadd231sd_fma(auVar33,auVar31,auVar31);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_1a8 - local_188;
        auVar21 = vfmadd231sd_fma(auVar21,auVar35,auVar35);
        auVar21 = vsqrtsd_avx(auVar21,auVar21);
        local_138 = auVar19._0_8_;
        if (1e-09 < auVar21._0_8_) {
          pCVar14 = (ChException *)__cxa_allocate_exception(0x28);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,
                     "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps"
                     ,"");
          ChException::ChException(pCVar14,&local_d8);
          __cxa_throw(pCVar14,&ChException::typeinfo,ChException::~ChException);
        }
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_158 * dStack_130;
        auVar21 = vfmsub213sd_fma(auVar20,auVar19,auVar28);
        if (auVar21._0_8_ < -1e-09) {
          local_178 = atan2(dStack_130,auVar19._0_8_);
          local_118 = atan2(dStack_150,local_158);
          pCVar11 = (ChCollisionShapeBullet *)::operator_new(0x28);
          local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (local_160->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
          p_Var1 = (local_160->
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            }
          }
          ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar11,PATH2D,&local_108);
          if (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pcVar13 = (cbt2DarcShape *)cbtAlignedAllocInternal(0x60,0x10);
          cbt2DarcShape::cbt2DarcShape
                    (pcVar13,(float)(double)local_1b8._0_8_,(float)(double)local_1b8._8_8_,0.0,
                     (float)(local_178 + 1.5707963267948966),(float)(local_118 + 1.5707963267948966)
                     ,false,mzthickness);
          pCVar11->m_bt_shape = (cbtCollisionShape *)pcVar13;
          (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
          (*(pcVar13->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0xb])(pcVar13);
          injectShape(this,local_170,local_168,pCVar11);
        }
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      lVar17 = lVar17 + 0x10;
      peVar15 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      psVar9 = (peVar15->lines).
               super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(peVar15->lines).
                                    super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4))
    ;
  }
  return true;
}

Assistant:

bool ChCollisionModelBullet::Add2Dpath(std::shared_ptr<ChMaterialSurface> material,
                                       std::shared_ptr<geometry::ChLinePath> mpath,
                                       const ChVector<>& pos,
                                       const ChMatrix33<>& rot,
                                       const double mthickness) {
    // The envelope is not used in this type of collision primitive.
    SetEnvelope(0);

    // if (!mpath.Get_closed())
    //    throw ChException("Error! Add2Dpath requires a CLOSED ChLinePath!");

    for (size_t i = 0; i < mpath->GetSubLinesCount(); ++i) {
        if (auto msegment = std::dynamic_pointer_cast<geometry::ChLineSegment>(mpath->GetSubLineN(i))) {
            if (msegment->pA.z() != msegment->pB.z())
                throw ChException("Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!");

            cbtVector3 pa((cbtScalar)msegment->pA.x(), (cbtScalar)msegment->pA.y(), (cbtScalar)0);
            cbtVector3 pb((cbtScalar)msegment->pB.x(), (cbtScalar)msegment->pB.y(), (cbtScalar)0);

            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DsegmentShape(pa, pb, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else if (auto marc = std::dynamic_pointer_cast<geometry::ChLineArc>(mpath->GetSubLineN(i))) {
            if ((marc->origin.rot.e1() != 0) || (marc->origin.rot.e2() != 0))
                throw ChException("Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!");
            double mangle1 = marc->angle1;
            double mangle2 = marc->angle2;
            if (mangle1 - mangle2 == CH_C_2PI)
                mangle1 -= 1e-7;
            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DarcShape((cbtScalar)marc->origin.pos.x(), (cbtScalar)marc->origin.pos.y(),
                                                  (cbtScalar)marc->radius, (cbtScalar)mangle1, (cbtScalar)mangle2,
                                                  marc->counterclockwise, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else {
            throw ChException("Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment.");
        }

        size_t i_prev = i;
        size_t i_next = i + 1;
        if (i_next >= mpath->GetSubLinesCount())
            if ((mpath->GetEndA() - mpath->GetEndB()).Length() <
                1e-9)        // can't use Get_closed() that is user preference via Set_closed()
                i_next = 0;  // closed path
        if (i_next < mpath->GetSubLinesCount()) {
            std::shared_ptr<geometry::ChLine> mline_prev = mpath->GetSubLineN(i_prev);
            std::shared_ptr<geometry::ChLine> mline_next = mpath->GetSubLineN(i_next);
            ChVector<> pos_prev, pos_next;
            ChVector<> dir_prev, dir_next;
            mline_prev->Evaluate(pos_prev, 1);
            mline_next->Evaluate(pos_next, 0);
            mline_prev->Derive(dir_prev, 1);
            mline_next->Derive(dir_next, 0);
            dir_prev.Normalize();
            dir_next.Normalize();

            // check if connected segments
            if ((pos_prev - pos_next).Length() > 1e-9)
                throw ChException(
                    "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps");

            // insert a 0-radius fillet arc at sharp corners, to allow for sharp-corner vs arc/segment
            if (Vcross(dir_prev, dir_next).z() < -1e-9) {
                double mangle1 = atan2(dir_prev.y(), dir_prev.x()) + CH_C_PI_2;
                double mangle2 = atan2(dir_next.y(), dir_next.x()) + CH_C_PI_2;

                auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
                shape->m_bt_shape =
                    new cbt2DarcShape((cbtScalar)pos_prev.x(), (cbtScalar)pos_prev.y(), (cbtScalar)0,
                                      (cbtScalar)mangle1, (cbtScalar)mangle2, false, (cbtScalar)mthickness);
                shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
                injectShape(pos, rot, shape);
                // GetLog() << "convex corner between " << i_next << " and " << i_next << " w.angles: " << mangle1 << "
                // " << mangle2 << "\n";
            } else {
                // GetLog() << "concave corner between " << i_next << " and " << i_next << "\n";
            }
        }
    }

    return true;
}